

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestError *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  char *local_280;
  MessageBuilder local_278;
  int local_f8;
  GLenum error_code;
  _uniform_function local_e4;
  uint local_e0;
  _uniform_function uniform_function;
  uint n_uniform_function;
  uint n_uniform_functions;
  _uniform_function uniform_functions [13];
  bool result;
  Functions *gl;
  GLdouble double_values [16];
  GPUShaderFP64Test1 *this_local;
  
  memcpy(&gl,&DAT_029eea20,0x80);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar1);
  uniform_functions[0xb]._3_1_ = 1;
  memcpy(&n_uniform_function,&DAT_029eeaa0,0x34);
  uniform_function = UNIFORM_FUNCTION_MATRIX3X4DV;
  for (local_e0 = 0; local_e0 < 0xd; local_e0 = local_e0 + 1) {
    local_e4 = (&n_uniform_function)[local_e0];
    switch(local_e4) {
    case UNIFORM_FUNCTION_1DV:
      (**(code **)(stack0xffffffffffffff60 + 0x14d8))
                (this->m_po_double_arr_uniform_location,0xffffffff,&gl);
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized uniform function",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0xad5);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    case UNIFORM_FUNCTION_2DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1518))
                (this->m_po_dvec2_arr_uniform_location,0xffffffff,&gl);
      break;
    case UNIFORM_FUNCTION_3DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1558))
                (this->m_po_dvec3_arr_uniform_location,0xffffffff,&gl);
      break;
    case UNIFORM_FUNCTION_4DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1598))
                (this->m_po_dvec4_arr_uniform_location,0xffffffff,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX2DV:
      (**(code **)(stack0xffffffffffffff60 + 0x15d8))
                (this->m_po_dmat2_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX2X3DV:
      (**(code **)(stack0xffffffffffffff60 + 0x15e8))
                (this->m_po_dmat2x3_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX2X4DV:
      (**(code **)(stack0xffffffffffffff60 + 0x15f8))
                (this->m_po_dmat2x4_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX3DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1608))
                (this->m_po_dmat3_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX3X2DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1618))
                (this->m_po_dmat3x2_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX3X4DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1628))
                (this->m_po_dmat3x4_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX4DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1638))
                (this->m_po_dmat4_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX4X2DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1648))
                (this->m_po_dmat4x2_arr_uniform_location,0xffffffff,0,&gl);
      break;
    case UNIFORM_FUNCTION_MATRIX4X3DV:
      (**(code **)(stack0xffffffffffffff60 + 0x1658))
                (this->m_po_dmat4x3_arr_uniform_location,0xffffffff,0,&gl);
    }
    local_f8 = (**(code **)(stack0xffffffffffffff60 + 0x800))();
    if (local_f8 != 0x501) {
      this_01 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_278,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_278,(char (*) [10])"Function ");
      local_280 = getUniformFunctionString(this,local_e4);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_280);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (pMVar3,(char (*) [91])
                                 "() was called with a negative count argument but did not generate a GL_INVALID_VALUE error"
                         );
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_278);
      uniform_functions[0xb]._3_1_ = UNIFORM_FUNCTION_1D >> 0x18;
    }
  }
  return (bool)(uniform_functions[0xb]._3_1_ & 1);
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingDoubleUniformFunctionsWithNegativeCount()
{
	const glw::GLdouble double_values[16] = { 1.0, 2.0,  3.0,  4.0,  5.0,  6.0,  7.0,  8.0,
											  9.0, 10.0, 11.0, 12.0, 13.0, 14.0, 15.0, 16.0 };
	const glw::Functions&   gl					= m_context.getRenderContext().getFunctions();
	bool					result				= true;
	const _uniform_function uniform_functions[] = { UNIFORM_FUNCTION_1DV,		  UNIFORM_FUNCTION_2DV,
													UNIFORM_FUNCTION_3DV,		  UNIFORM_FUNCTION_4DV,
													UNIFORM_FUNCTION_MATRIX2DV,   UNIFORM_FUNCTION_MATRIX2X3DV,
													UNIFORM_FUNCTION_MATRIX2X4DV, UNIFORM_FUNCTION_MATRIX3DV,
													UNIFORM_FUNCTION_MATRIX3X2DV, UNIFORM_FUNCTION_MATRIX3X4DV,
													UNIFORM_FUNCTION_MATRIX4DV,   UNIFORM_FUNCTION_MATRIX4X2DV,
													UNIFORM_FUNCTION_MATRIX4X3DV };
	const unsigned int n_uniform_functions = sizeof(uniform_functions) / sizeof(uniform_functions[0]);

	for (unsigned int n_uniform_function = 0; n_uniform_function < n_uniform_functions; ++n_uniform_function)
	{
		_uniform_function uniform_function = uniform_functions[n_uniform_function];

		switch (uniform_function)
		{
		case UNIFORM_FUNCTION_1DV:
			gl.uniform1dv(m_po_double_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_2DV:
			gl.uniform2dv(m_po_dvec2_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_3DV:
			gl.uniform3dv(m_po_dvec3_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_4DV:
			gl.uniform4dv(m_po_dvec4_arr_uniform_location, -1, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2DV:
			gl.uniformMatrix2dv(m_po_dmat2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2X3DV:
			gl.uniformMatrix2x3dv(m_po_dmat2x3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX2X4DV:
			gl.uniformMatrix2x4dv(m_po_dmat2x4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3DV:
			gl.uniformMatrix3dv(m_po_dmat3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3X2DV:
			gl.uniformMatrix3x2dv(m_po_dmat3x2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX3X4DV:
			gl.uniformMatrix3x4dv(m_po_dmat3x4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4DV:
			gl.uniformMatrix4dv(m_po_dmat4_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4X2DV:
			gl.uniformMatrix4x2dv(m_po_dmat4x2_arr_uniform_location, -1, GL_FALSE, double_values);
			break;
		case UNIFORM_FUNCTION_MATRIX4X3DV:
			gl.uniformMatrix4x3dv(m_po_dmat4x3_arr_uniform_location, -1, GL_FALSE, double_values);
			break;

		default:
		{
			TCU_FAIL("Unrecognized uniform function");
		}
		} /* switch (uniform_function) */

		/* Make sure GL_INVALID_VALUE was generated */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_VALUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Function " << getUniformFunctionString(uniform_function)
							   << "() "
								  "was called with a negative count argument but did not generate a "
								  "GL_INVALID_VALUE error"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all uniform functions) */

	return result;
}